

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_serve_static_content.cpp
# Opt level: O0

char * __thiscall (anonymous_namespace)::reader::gets_abi_cxx11_(reader *this,char *__s)

{
  long in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  pstore local_80 [32];
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  local_60;
  long local_38 [2];
  long local_28;
  size_type pos;
  state_type start_local;
  reader *this_local;
  
  start_local = (state_type)__s;
  this_local = (reader *)this;
  if (in_RDX == -1) {
    pstore::assert_failed
              ("start != std::string::npos",
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
               ,99);
  }
  local_28 = std::__cxx11::string::find(*(char **)__s,0x215eba);
  if (local_28 != -1) {
    local_38[0] = local_28 + 2;
    std::__cxx11::string::substr((ulong)local_80,*(ulong *)__s);
    pstore::just<std::__cxx11::string>(&local_60,local_80,value);
    pstore::error_or<std::tuple<unsigned_long,pstore::maybe<std::__cxx11::string,void>>>::
    error_or<unsigned_long,pstore::maybe<std::__cxx11::string,void>>
              ((error_or<std::tuple<unsigned_long,pstore::maybe<std::__cxx11::string,void>>> *)this,
               local_38,&local_60);
    pstore::
    maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    ~maybe(&local_60);
    std::__cxx11::string::~string((string *)local_80);
    return (char *)this;
  }
  pstore::assert_failed
            ("pos != std::string::npos",
             "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_serve_static_content.cpp"
             ,0x65);
}

Assistant:

decltype (auto) gets (state_type const start) {
            using result_type = pstore::error_or_n<state_type, pstore::maybe<std::string>>;

            static auto const crlf = pstore::http::crlf;
            static auto const crlf_len = std::strlen (crlf);

            PSTORE_ASSERT (start != std::string::npos);
            auto const pos = src_.find (crlf, start);
            PSTORE_ASSERT (pos != std::string::npos);
            return result_type{pstore::in_place, pos + crlf_len,
                               pstore::just (src_.substr (start, pos - start))};
        }